

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QByteArrayView __thiscall Moc::strippedFileName(Moc *this)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  QByteArrayView QVar7;
  
  pcVar2 = (this->filename).d.ptr;
  uVar3 = (this->filename).d.size;
  pcVar1 = pcVar2 + uVar3;
  pcVar4 = pcVar1;
  if (3 < uVar3) {
    pcVar4 = pcVar1 + -(uVar3 & 0xfffffffffffffffc);
    lVar6 = (uVar3 >> 2) + 1;
    pcVar5 = pcVar1;
    do {
      if ((pcVar5[-1] == '/') || (pcVar5[-1] == '\\')) goto LAB_0011e77f;
      if ((pcVar5[-2] == '/') || (pcVar5[-2] == '\\')) {
        pcVar5 = pcVar5 + -1;
        goto LAB_0011e77f;
      }
      if ((pcVar5[-3] == '/') || (pcVar5[-3] == '\\')) {
        pcVar5 = pcVar5 + -2;
        goto LAB_0011e77f;
      }
      if ((pcVar5[-4] == '/') || (pcVar5[-4] == '\\')) {
        pcVar5 = pcVar5 + -3;
        goto LAB_0011e77f;
      }
      pcVar5 = pcVar5 + -4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar4 - (long)pcVar2;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pcVar5 = pcVar2;
      if (((lVar6 != 3) || (pcVar5 = pcVar4, pcVar4[-1] == '/')) || (pcVar4[-1] == '\\'))
      goto LAB_0011e77f;
      pcVar4 = pcVar4 + -1;
    }
    pcVar5 = pcVar4;
    if ((pcVar4[-1] == '/') || (pcVar4[-1] == '\\')) goto LAB_0011e77f;
    pcVar4 = pcVar4 + -1;
  }
  pcVar5 = pcVar4;
  if ((pcVar4[-1] != '/') && (pcVar4[-1] != '\\')) {
    pcVar5 = pcVar2;
  }
LAB_0011e77f:
  lVar6 = 0;
  if (pcVar5 != pcVar2) {
    lVar6 = uVar3 - ((long)pcVar1 - (long)pcVar5);
    uVar3 = (long)pcVar1 - (long)pcVar5;
  }
  QVar7.m_data = pcVar2 + lVar6;
  QVar7.m_size = uVar3;
  return QVar7;
}

Assistant:

const T *data() const noexcept { return ptr; }